

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O1

uint If_CluSemiCanonicize(word *pTruth,int nVars,int *pCanonPerm)

{
  ulong *puVar1;
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  word wVar5;
  bool bVar6;
  uint uVar7;
  word *pIn;
  bool bVar8;
  uint uVar9;
  word *pOut;
  ulong uVar10;
  int pStore [32];
  word pFunc [1024];
  int local_20b8 [32];
  word local_2038 [1025];
  
  If_CluCountOnesInCofs(pTruth,nVars,local_20b8);
  if (nVars < 1) {
    uVar9 = 0;
  }
  else {
    uVar10 = 0;
    uVar9 = 0;
    do {
      iVar2 = local_20b8[uVar10 * 2];
      iVar3 = *(int *)((long)local_2038 + uVar10 * 8 + -0x7c);
      if (iVar3 < iVar2) {
        uVar9 = uVar9 | 1 << ((uint)uVar10 & 0x1f);
        local_20b8[uVar10 * 2] = iVar3;
        *(int *)((long)local_2038 + uVar10 * 8 + -0x7c) = iVar2;
        If_CluChangePhase(pTruth,nVars,(uint)uVar10);
      }
      uVar10 = uVar10 + 1;
    } while ((uint)nVars != uVar10);
  }
  if (0 < nVars) {
    uVar10 = 0;
    do {
      pCanonPerm[uVar10] = (int)uVar10;
      uVar10 = uVar10 + 1;
    } while ((uint)nVars != uVar10);
  }
  bVar8 = false;
  pOut = local_2038;
  do {
    bVar6 = true;
    if (1 < nVars) {
      uVar10 = 0;
      bVar6 = false;
      pIn = pTruth;
      do {
        iVar2 = local_20b8[uVar10 * 2];
        wVar5 = local_2038[uVar10 - 0xf];
        pTruth = pIn;
        if ((int)wVar5 < iVar2) {
          puVar1 = (ulong *)(pCanonPerm + uVar10);
          *puVar1 = *puVar1 << 0x20 | *puVar1 >> 0x20;
          bVar8 = (bool)(bVar8 ^ 1);
          local_20b8[uVar10 * 2] = (int)wVar5;
          *(int *)(local_2038 + (uVar10 - 0xf)) = iVar2;
          uVar4 = *(undefined4 *)((long)local_2038 + uVar10 * 8 + -0x7c);
          *(undefined4 *)((long)local_2038 + uVar10 * 8 + -0x7c) =
               *(undefined4 *)((long)local_2038 + uVar10 * 8 + -0x74);
          *(undefined4 *)((long)local_2038 + uVar10 * 8 + -0x74) = uVar4;
          If_CluSwapAdjacent(pOut,pIn,(int)uVar10,nVars);
          bVar6 = true;
          pTruth = pOut;
          pOut = pIn;
        }
        uVar10 = uVar10 + 1;
        pIn = pTruth;
      } while (nVars - 1 != uVar10);
      bVar6 = !bVar6;
    }
  } while (!bVar6);
  if (bVar8) {
    uVar7 = 1 << ((char)nVars - 6U & 0x1f);
    if (nVars < 7) {
      uVar7 = 1;
    }
    if (0 < (int)uVar7) {
      memcpy(pOut,pTruth,(ulong)uVar7 << 3);
    }
  }
  return uVar9;
}

Assistant:

unsigned If_CluSemiCanonicize( word * pTruth, int nVars, int * pCanonPerm )
{
    word pFunc[CLU_WRD_MAX], * pIn = pTruth, * pOut = pFunc, * pTemp;
    int pStore[CLU_VAR_MAX*2];
    unsigned uCanonPhase = 0;
    int i, Temp, fChange, Counter = 0;
//Kit_DsdPrintFromTruth( (unsigned*)pTruth, nVars ); printf( "\n" );

    // collect signatures 
    If_CluCountOnesInCofs( pTruth, nVars, pStore );
    // canonicize phase
    for ( i = 0; i < nVars; i++ )
    {
        if ( pStore[2*i+0] <= pStore[2*i+1] )
            continue;
        uCanonPhase |= (1 << i);
        Temp = pStore[2*i+0];
        pStore[2*i+0] = pStore[2*i+1];
        pStore[2*i+1] = Temp;
        If_CluChangePhase( pIn, nVars, i );
    }
    // compute permutation
    for ( i = 0; i < nVars; i++ )
        pCanonPerm[i] = i;
    do {
        fChange = 0;
        for ( i = 0; i < nVars-1; i++ )
        {
            if ( pStore[2*i] <= pStore[2*(i+1)] )
                continue;
            Counter++;
            fChange = 1;

            Temp = pCanonPerm[i];
            pCanonPerm[i] = pCanonPerm[i+1];
            pCanonPerm[i+1] = Temp;

            Temp = pStore[2*i];
            pStore[2*i] = pStore[2*(i+1)];
            pStore[2*(i+1)] = Temp;

            Temp = pStore[2*i+1];
            pStore[2*i+1] = pStore[2*(i+1)+1];
            pStore[2*(i+1)+1] = Temp;

            If_CluSwapAdjacent( pOut, pIn, i, nVars );
            pTemp = pIn; pIn = pOut; pOut = pTemp;
        }
    } while ( fChange );
    // swap if it was moved an odd number of times
    if ( Counter & 1 )
        If_CluCopy( pOut, pIn, nVars );
    return uCanonPhase;
}